

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Concat.hpp
# Opt level: O1

void __thiscall
linq::
ConcatState<linq::AdapterState<light_&,_std::vector<light,_std::allocator<light>_>_&>,_linq::IEnumerableCore<linq::AdapterState<light_&,_std::vector<light,_std::allocator<light>_>_&>_>,_light_&>
::Advance(ConcatState<linq::AdapterState<light_&,_std::vector<light,_std::allocator<light>_>_&>,_linq::IEnumerableCore<linq::AdapterState<light_&,_std::vector<light,_std::allocator<light>_>_&>_>,_light_&>
          *this)

{
  iterator *piVar1;
  light *plVar2;
  
  if (this->s1 != true) {
    piVar1 = &(this->source2).source.current;
    piVar1->_M_current = piVar1->_M_current + 1;
    return;
  }
  plVar2 = (this->source1).current._M_current + 1;
  (this->source1).current._M_current = plVar2;
  if (plVar2 != (this->source1).end._M_current) {
    return;
  }
  this->s1 = false;
  return;
}

Assistant:

void Advance() override final
		{
			if(s1){
				source1.Advance();
				if(!source1.Valid())
					s1 = false;
			}
			else
				source2.Advance();
		}